

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O2

void work_mgga_vxc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,xc_mgga_out_params *out)

{
  uint uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar72;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar73;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  undefined1 auVar84 [16];
  double dVar94;
  undefined1 auVar85 [16];
  double dVar95;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  double dVar114;
  double dVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  double dVar115;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  double dVar177;
  double dVar178;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  double dVar191;
  double dVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  double dVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  double dVar202;
  double dVar203;
  double dVar204;
  undefined1 auVar205 [16];
  double dVar206;
  undefined1 auVar207 [16];
  double dVar208;
  double dVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  double dVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  double dVar218;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  double local_868;
  double local_860;
  double local_858;
  double local_798;
  double local_528;
  double dStack_520;
  double local_518;
  double dStack_510;
  double local_508;
  double dStack_500;
  double local_488;
  double dStack_480;
  undefined1 local_398 [112];
  undefined1 local_328 [16];
  double local_298;
  double local_288;
  double local_248;
  double dStack_240;
  
  local_868 = 0.0;
  for (sVar5 = 0; np != sVar5; sVar5 = sVar5 + 1) {
    lVar4 = (long)(p->dim).rho * sVar5;
    dVar9 = rho[lVar4];
    if (p->nspin == 2) {
      dVar9 = dVar9 + rho[lVar4 + 1];
    }
    dVar83 = p->dens_threshold;
    if (dVar83 <= dVar9) {
      dVar9 = rho[lVar4];
      if (rho[lVar4] <= dVar83) {
        dVar9 = dVar83;
      }
      dVar10 = p->sigma_threshold * p->sigma_threshold;
      local_860 = sigma[(long)(p->dim).sigma * sVar5];
      if (sigma[(long)(p->dim).sigma * sVar5] <= dVar10) {
        local_860 = dVar10;
      }
      uVar1 = p->info->flags;
      if ((uVar1 >> 0x10 & 1) != 0) {
        local_868 = tau[(long)(p->dim).tau * sVar5];
        if (tau[(long)(p->dim).tau * sVar5] <= p->tau_threshold) {
          local_868 = p->tau_threshold;
        }
        if (((uVar1 >> 0x11 & 1) != 0) && (dVar10 = dVar9 * 8.0 * local_868, dVar10 <= local_860)) {
          local_860 = dVar10;
        }
      }
      dVar10 = p->zeta_threshold;
      dVar141 = (double)(-(ulong)(dVar10 < 1.0) & 0x3ff0000000000000 |
                        ~-(ulong)(dVar10 < 1.0) & (ulong)(dVar10 + -1.0 + 1.0));
      uVar6 = -(ulong)(dVar141 <= dVar10);
      dVar10 = (double)(uVar6 & (ulong)dVar10 | ~uVar6 & (ulong)dVar141);
      dVar11 = cbrt(dVar10);
      dVar12 = cbrt(dVar9);
      dVar13 = (1.0 / dVar9) * local_860;
      dVar47 = 1.0 / local_868;
      dVar14 = dVar13 * dVar47 * 0.125;
      dVar141 = dVar14;
      if (1.0 <= dVar14) {
        dVar141 = 1.0;
      }
      dVar48 = dVar141 * dVar141;
      dVar74 = dVar141 * dVar48 + 1.0;
      dVar15 = cbrt(9.0);
      dVar16 = cbrt(0.3183098861837907);
      dVar16 = dVar16 * dVar16 * dVar15 * dVar15;
      dVar49 = p->cam_omega * dVar16;
      dVar15 = cbrt(9.869604401089358);
      auVar220._0_8_ = 1.0 / (dVar12 * dVar12);
      auVar110._0_8_ = dVar9 * dVar9;
      auVar110._8_8_ = dVar15 * dVar15;
      local_328._8_8_ = 0x3ff0000000000000;
      local_328._0_8_ = auVar220._0_8_;
      auVar220._8_8_ = 0x3ff0000000000000;
      auVar84 = divpd(auVar220,auVar110);
      dVar75 = auVar84._0_8_;
      dVar50 = local_860 * 1.5874010519681996 * dVar75;
      dVar94 = auVar84._8_8_;
      dVar72 = dVar94 * 1.8171205928321397;
      dVar51 = dVar50 * dVar72;
      dVar96 = ((1.0 / dVar15) / 9.869604401089358) * 3.3019272488946267;
      dVar114 = local_860 * local_860 * 1.2599210498948732;
      dVar134 = 1.0 / dVar12;
      dVar76 = dVar134 / (dVar9 * auVar110._0_8_ * auVar110._0_8_);
      dVar17 = dVar96 * 0.00537989809245259 * dVar114 * dVar76 + dVar51 * 0.1504548888888889 + 1.0;
      dVar15 = pow(dVar17,0.1);
      auVar160._8_8_ = dVar15;
      auVar160._0_8_ = dVar11;
      auVar84 = divpd(_DAT_00f48900,auVar160);
      dVar120 = auVar84._0_8_;
      dVar52 = dVar134 * 1.4422495703074083 * dVar49;
      dVar53 = (dVar52 * auVar84._8_8_ * dVar120) / 18.0;
      dVar15 = 1e-10;
      if (1e-10 <= dVar53) {
        dVar15 = dVar53;
      }
      dVar54 = 1.35;
      if (dVar15 <= 1.35) {
        dVar54 = dVar15;
      }
      dVar18 = 1.0 / dVar54;
      dVar19 = erf(dVar18 * 0.5);
      dVar55 = dVar54 * dVar54;
      dVar20 = exp((1.0 / dVar55) * -0.25);
      dVar139 = dVar15;
      if (dVar15 <= 1.35) {
        dVar139 = 1.35;
      }
      dVar177 = dVar139 * dVar139;
      dVar191 = dVar177 * dVar177;
      dVar77 = dVar191 * dVar191;
      auVar142._0_8_ = dVar77 * dVar77;
      auVar142._8_8_ = dVar77;
      auVar160 = divpd(_DAT_00f48900,auVar142);
      dVar77 = dVar55 * -2.0 * (dVar20 + -1.0) + dVar20 + -1.5;
      dVar19 = (dVar54 + dVar54) * dVar77 + dVar19 * 1.7724538509055159;
      dVar183 = auVar160._8_8_;
      auVar126._8_8_ = dVar183;
      auVar126._0_8_ = dVar183;
      if (dVar15 < 1.35) {
        local_798 = dVar54 * -2.6666666666666665 * dVar19 + 1.0;
      }
      else {
        auVar121._0_8_ = dVar183 / (dVar177 * dVar191);
        auVar85._0_8_ = 1.0 / (dVar177 * dVar191);
        auVar106._8_8_ = dVar191;
        auVar106._0_8_ = dVar177;
        auVar142 = divpd(_DAT_00f48900,auVar106);
        auVar143 = divpd(auVar142,_DAT_00f54be0);
        auVar85._8_8_ = dVar183;
        auVar85 = divpd(auVar85,_DAT_00f54bf0);
        auVar142 = divpd(auVar126,auVar106);
        auVar106 = divpd(auVar142,_DAT_00f54c00);
        auVar121._8_8_ = auVar160._0_8_;
        auVar142 = divpd(auVar121,_DAT_00f54c10);
        local_798 = ((((((auVar143._0_8_ - auVar143._8_8_) + auVar85._0_8_) - auVar85._8_8_) +
                      auVar106._0_8_) - auVar106._8_8_) + auVar142._0_8_) - auVar142._8_8_;
      }
      dVar21 = dVar141 * dVar48 * 3.0 + dVar48;
      dVar22 = 1.0 / (dVar74 * dVar74);
      dVar23 = pow(dVar17,0.2);
      dVar24 = 0.27;
      if (dVar15 <= 0.27) {
        dVar24 = dVar15;
      }
      dVar56 = dVar24 * dVar24;
      dVar25 = exp((-1.0 / dVar56) * 0.25);
      dVar26 = erf((1.0 / dVar24) * 0.5);
      dVar140 = dVar15;
      if (dVar15 <= 0.27) {
        dVar140 = 0.27;
      }
      dVar202 = dVar140 * dVar140;
      dVar208 = dVar202 * dVar202;
      dVar178 = dVar208 * dVar208;
      dVar155 = dVar178 * dVar178;
      auVar143._8_8_ = dVar155 * dVar155;
      auVar143._0_8_ = dVar155;
      auVar142 = divpd(_DAT_00f48900,auVar143);
      dVar97 = dVar56 * dVar56 * 64.0;
      dVar78 = dVar56 * 20.0 - dVar97;
      dVar97 = dVar56 * -36.0 + dVar24 * 17.724538509055158 * dVar26 + dVar78 * dVar25 + dVar97 +
               -3.0;
      local_398._8_8_ = auVar142._0_8_;
      auVar193._8_8_ = auVar142._8_8_;
      local_398._0_8_ = local_398._8_8_;
      if (dVar15 < 0.27) {
        dVar115 = dVar56 * 24.0 * dVar97 + 1.0;
      }
      else {
        auVar124._0_8_ = dVar178 * dVar202;
        auVar124._8_8_ = dVar155 * dVar202;
        auVar145._0_8_ = dVar208 * dVar178;
        auVar222._8_8_ = auVar145._0_8_;
        auVar222._0_8_ = dVar208;
        auVar145._8_8_ = auVar124._0_8_;
        auVar122._8_8_ = local_398._8_8_;
        auVar122._0_8_ = local_398._8_8_;
        auVar121 = divpd(auVar122,auVar145);
        auVar122 = divpd(auVar121,_DAT_00fb6480);
        auVar161._8_8_ = auVar193._8_8_ / auVar145._0_8_;
        auVar161._0_8_ = 0x3f55f15f15f15f16;
        auVar162._8_8_ = 0x47b9867eba1668be;
        auVar162._0_8_ = dVar208;
        auVar162 = divpd(auVar161,auVar162);
        auVar190._0_8_ = dVar202 * dVar208;
        auVar185._0_8_ = -(double)local_398._8_8_;
        auVar185._8_8_ = local_398._8_8_;
        auVar187._8_8_ = dVar178;
        auVar187._0_8_ = auVar190._0_8_;
        auVar121 = divpd(auVar185,auVar187);
        auVar106 = divpd(auVar121,_DAT_00fb6470);
        dVar115 = dVar178 * auVar190._0_8_;
        auVar184._8_8_ = (double)local_398._8_8_ / dVar115;
        auVar184._0_8_ = auVar193._8_8_;
        auVar185 = divpd(auVar184,_DAT_00fb6490);
        auVar215._8_8_ = 0x3ff0000000000000;
        auVar215._0_8_ = auVar193._8_8_;
        auVar163._8_8_ = auVar124._0_8_;
        auVar163._0_8_ = dVar202;
        auVar186._8_8_ = 0x3ff0000000000000;
        auVar186._0_8_ = auVar193._8_8_;
        auVar121 = divpd(auVar186,auVar163);
        auVar187 = divpd(auVar121,_DAT_00fb64b0);
        auVar144._8_8_ = 0x3ff0000000000000;
        auVar144._0_8_ = auVar193._8_8_;
        auVar121 = divpd(auVar144,auVar222);
        auVar145 = divpd(auVar121,_DAT_00fb64c0);
        auVar190._8_8_ = dVar115;
        auVar225._8_8_ = 0x3ff0000000000000;
        auVar225._0_8_ = auVar193._8_8_;
        auVar121 = divpd(auVar225,auVar190);
        auVar143 = divpd(auVar121,_DAT_00fb64d0);
        auVar198._0_8_ = auVar193._8_8_ / dVar178;
        auVar198._8_8_ = local_398._8_8_;
        auVar121 = divpd(auVar198,_DAT_00fb64e0);
        auVar85 = divpd(auVar215,auVar124);
        auVar85 = divpd(auVar85,_DAT_00fb64f0);
        dVar115 = auVar85._8_8_ +
                  auVar121._8_8_ +
                  auVar143._8_8_ +
                  auVar145._8_8_ +
                  auVar187._8_8_ +
                  (1.0 / dVar178) * 3.804788961038961e-06 +
                  (1.0 / auVar190._0_8_) / -11520.0 +
                  auVar162._8_8_ + (auVar193._8_8_ / dVar115) / -3.511556992918352e+39 +
                  auVar162._0_8_ + ((double)local_398._8_8_ / dVar208) / 927028425523200.0 +
                  auVar85._0_8_ +
                  auVar121._0_8_ +
                  auVar143._0_8_ +
                  auVar145._0_8_ +
                  auVar187._0_8_ +
                  ((((auVar106._8_8_ + auVar106._0_8_) - auVar122._8_8_) + auVar122._0_8_) -
                  auVar185._8_8_) + auVar185._0_8_;
      }
      dVar11 = dVar11 * dVar10;
      dVar79 = dVar21 * dVar22;
      dVar80 = 1.0 / dVar23;
      auVar38._8_8_ = dVar23 * dVar23;
      auVar38._0_8_ = dVar9;
      auVar121 = divpd(local_328,auVar38);
      dVar81 = auVar121._0_8_;
      dVar98 = local_868 * 1.5874010519681996 * dVar81;
      dVar99 = dVar98 * 0.14554132;
      dVar100 = dVar50 * 0.04229627833333333 +
                (auVar110._8_8_ * 3.3019272488946267 * 0.043662396 - dVar99);
      dVar95 = auVar121._8_8_;
      dVar23 = dVar95 * dVar72;
      dVar10 = 0.32;
      if (dVar15 <= 0.32) {
        dVar10 = dVar15;
      }
      dVar82 = dVar10 * dVar10;
      dVar27 = 1.0 / dVar82;
      dVar28 = exp(dVar27 * -0.25);
      dVar29 = erf((1.0 / dVar10) * 0.5);
      dVar204 = dVar15;
      if (dVar15 <= 0.32) {
        dVar204 = 0.32;
      }
      dVar206 = dVar204 * dVar204;
      dVar209 = dVar206 * dVar206;
      dVar212 = dVar209 * dVar209;
      dVar57 = dVar212 * dVar212;
      dVar135 = 1.0 / dVar57;
      auVar228._0_8_ = 1.0 / (dVar57 * dVar57);
      dVar203 = dVar10 * dVar82;
      dVar196 = dVar82 * dVar82;
      dVar179 = dVar10 * dVar196;
      dVar58 = dVar196 * dVar196;
      dVar218 = dVar10 * dVar58 * -122880.0 +
                dVar196 * dVar203 * 3840.0 + dVar179 * -576.0 + dVar10 * -8.0 + dVar203 * 256.0;
      dVar180 = dVar82 * dVar196;
      dVar181 = dVar180 * 5120.0 + dVar196 * -1440.0 + dVar82 * 224.0 + -35.0;
      dVar156 = dVar82 * 60.0 + -2.0;
      dVar59 = dVar203 * 24.0;
      dVar57 = dVar218 * dVar28 + dVar156 * 3.5449077018110318 * dVar29 + dVar59 * dVar181;
      if (dVar15 < 0.32) {
        dVar101 = dVar10 * 1.1428571428571428 * dVar57 + 1.0;
      }
      else {
        dVar101 = dVar206 * dVar209;
        auVar86._8_8_ = dVar135 / dVar206;
        auVar86._0_8_ = dVar135;
        auVar64._8_8_ = dVar135;
        auVar64._0_8_ = dVar135;
        auVar39._8_8_ = dVar101;
        auVar39._0_8_ = dVar209;
        auVar107._8_8_ = dVar135;
        auVar107._0_8_ = dVar135;
        auVar146._8_8_ = dVar206 * dVar212;
        auVar146._0_8_ = dVar212;
        auVar123._8_8_ = dVar135;
        auVar123._0_8_ = dVar135;
        auVar124 = divpd(auVar123,auVar146);
        auVar164._0_8_ = dVar212 * dVar209;
        auVar164._8_8_ = dVar212 * dVar101;
        auVar121 = divpd(auVar64,auVar164);
        auVar106 = divpd(auVar86,_DAT_00fb6500);
        auVar85 = divpd(auVar107,auVar39);
        auVar143 = divpd(auVar85,_DAT_00fb6510);
        auVar124 = divpd(auVar124,_DAT_00fb6520);
        auVar121 = divpd(auVar121,_DAT_00fb6530);
        auVar87._8_8_ = auVar228._0_8_ / dVar206;
        auVar87._0_8_ = auVar228._0_8_;
        auVar85 = divpd(auVar87,_DAT_00fb6540);
        auVar228._8_8_ = auVar228._0_8_;
        auVar145 = divpd(auVar228,auVar39);
        auVar145 = divpd(auVar145,_DAT_00fb6550);
        dVar101 = ((((((((((((1.0 / auVar164._8_8_) / -115811942400.0 +
                             (1.0 / auVar164._0_8_) / 2530344960.0 +
                             (1.0 / (dVar206 * dVar212)) / -61501440.0 +
                             (1.0 / dVar212) * 5.871587902837903e-07 +
                             (1.0 / dVar101) / -56448.0 + 0.0003826530612244898 / dVar209 +
                            auVar106._0_8_) - auVar106._8_8_) + auVar143._0_8_) - auVar143._8_8_) +
                        auVar124._0_8_) - auVar124._8_8_) + auVar121._0_8_) - auVar121._8_8_) +
                    auVar85._0_8_) - auVar85._8_8_) + auVar145._0_8_) - auVar145._8_8_;
      }
      dVar30 = dVar9 * 0.5;
      dVar136 = dVar94 * dVar101 * 1.8171205928321397;
      dVar116 = dVar50 * dVar95;
      dVar31 = dVar136 * 0.026329605555555555;
      dVar32 = dVar31 * dVar116 +
               local_798 * dVar80 + dVar100 * dVar115 * 0.43209876543209874 * dVar23;
      dVar33 = 1.0 - dVar79;
      dVar34 = (dVar52 * dVar120) / 18.0;
      dVar52 = 1.35;
      if (dVar34 <= 1.35) {
        dVar52 = dVar34;
      }
      dVar35 = erf((1.0 / dVar52) * 0.5);
      dVar60 = dVar52 * dVar52;
      dVar36 = exp((1.0 / dVar60) * -0.25);
      dVar102 = dVar34;
      if (dVar34 <= 1.35) {
        dVar102 = 1.35;
      }
      dVar192 = dVar102 * dVar102;
      dVar182 = dVar192 * dVar192;
      dVar103 = dVar182 * dVar182;
      auVar65._0_8_ = dVar103 * dVar103;
      auVar65._8_8_ = dVar103;
      auVar121 = divpd(_DAT_00f48900,auVar65);
      dVar157 = dVar60 * -2.0 * (dVar36 + -1.0) + dVar36 + -1.5;
      dVar35 = dVar35 * 1.7724538509055159 + (dVar52 + dVar52) * dVar157;
      dVar103 = auVar121._8_8_;
      if (dVar34 < 1.35) {
        dVar117 = dVar52 * -2.6666666666666665 * dVar35 + 1.0;
      }
      else {
        auVar40._0_8_ = dVar103 / (dVar192 * dVar182);
        auVar88._0_8_ = 1.0 / (dVar192 * dVar182);
        auVar66._8_8_ = dVar182;
        auVar66._0_8_ = dVar192;
        auVar106 = divpd(_DAT_00f48900,auVar66);
        auVar124 = divpd(auVar106,_DAT_00f54be0);
        auVar88._8_8_ = dVar103;
        auVar85 = divpd(auVar88,_DAT_00f54bf0);
        auVar108._8_8_ = dVar103;
        auVar108._0_8_ = dVar103;
        auVar106 = divpd(auVar108,auVar66);
        auVar143 = divpd(auVar106,_DAT_00f54c00);
        auVar40._8_8_ = auVar121._0_8_;
        auVar106 = divpd(auVar40,_DAT_00f54c10);
        dVar117 = ((((((auVar124._0_8_ - auVar124._8_8_) + auVar85._0_8_) - auVar85._8_8_) +
                    auVar143._0_8_) - auVar143._8_8_) + auVar106._0_8_) - auVar106._8_8_;
      }
      dVar104 = (dVar51 * 0.0028577960676726107 + 0.12345679012345678) * 1.8171205928321397;
      dVar158 = dVar94 * dVar104;
      dVar137 = dVar51 / 36.0 +
                (dVar98 + dVar50 * -0.125) * 1.8171205928321397 * dVar94 * 0.25 + -0.45;
      dVar138 = 1.0 - dVar141;
      dVar105 = dVar141 * dVar137 * 1.0814814814814815;
      dVar61 = dVar33 * dVar117;
      dVar98 = pow((dVar137 * dVar137 * 0.7209876543209877 +
                   dVar158 * 0.4166666666666667 * dVar50 + 1.0) - dVar105 * dVar138,0.1);
      dVar118 = (dVar50 * 0.011867481666666667 +
                auVar110._8_8_ * 3.3019272488946267 * 0.256337604 + dVar99) * 0.5555555555555556 *
                -1.8171205928321397 * dVar94 + dVar51 * 0.06394332777777778 + 1.0;
      dVar119 = dVar118 * 0.7777777777777778 * dVar95 + dVar80;
      dVar99 = dVar33 * dVar98 +
               (dVar79 * dVar119 - (dVar79 * dVar32 + dVar61 * dVar98) * p->cam_beta);
      dVar50 = dVar12 * dVar11 * -0.36927938319101117;
      dVar51 = dVar50 * dVar99;
      dVar51 = (double)(~-(ulong)(dVar30 <= dVar83) & (ulong)(dVar51 + dVar51));
      pdVar2 = out->zk;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        lVar4 = (long)(p->dim).zk * sVar5;
        pdVar2[lVar4] = pdVar2[lVar4] + dVar51;
      }
      local_858 = 0.0;
      dVar159 = 0.0;
      if (dVar14 < 1.0) {
        dVar159 = (1.0 / auVar110._0_8_) * local_860 * dVar47 * -0.125;
      }
      auVar84._0_8_ = dVar134;
      auVar67._8_8_ = dVar17;
      auVar67._0_8_ = dVar9;
      auVar106 = divpd(auVar84,auVar67);
      dVar16 = dVar16 * p->cam_omega * 1.4422495703074083;
      dVar62 = auVar106._0_8_ * 1.4422495703074083;
      dVar73 = dVar134 * auVar106._8_8_;
      dVar37 = local_860 * 1.5874010519681996 * (auVar220._0_8_ / (dVar9 * auVar110._0_8_));
      dVar63 = dVar37 * dVar72;
      dVar114 = dVar114 * dVar96 * (dVar134 / (auVar110._0_8_ * auVar110._0_8_ * auVar110._0_8_));
      dVar134 = dVar63 * -0.40121303703703703 + dVar114 * -0.028692789826413812;
      dVar177 = dVar177 * dVar139;
      if (1e-10 <= dVar53) {
        auVar89._0_8_ = auVar84._8_8_ * dVar120 * -dVar49 * dVar62;
        auVar89._8_8_ = dVar120 * dVar134 * dVar16 * dVar73;
        auVar84 = divpd(auVar89,_DAT_00fb6580);
        local_858 = auVar84._0_8_ - auVar84._8_8_;
      }
      auVar41._0_8_ = dVar139 * dVar191;
      auVar210._8_8_ = dVar191 * dVar177;
      auVar210._0_8_ = dVar139;
      auVar41._8_8_ = dVar177;
      auVar84 = divpd(auVar126,auVar41);
      auVar219._8_8_ = 0x3ff0000000000000;
      auVar219._0_8_ = dVar183;
      auVar220 = divpd(auVar219,auVar210);
      auVar160 = divpd(auVar160,auVar210);
      dVar183 = (1.0 / dVar55) * dVar20;
      dVar55 = 1.0 / (dVar55 * dVar54);
      dVar139 = (dVar20 + -1.0) * dVar54 * -4.0;
      uVar6 = -(ulong)(1.35 < dVar15);
      if (dVar15 < 1.35) {
        dVar191 = (double)(~uVar6 & (ulong)local_858);
        local_288 = dVar191 * -2.6666666666666665 * dVar19 +
                    dVar54 * -2.6666666666666665 *
                    (((dVar54 + dVar54) *
                      ((dVar139 * dVar191 + dVar55 * dVar191 * dVar20 * 0.5) -
                      dVar191 * dVar18 * dVar20) + (dVar77 + dVar77) * dVar191) - dVar191 * dVar183)
        ;
      }
      else {
        dVar191 = (double)(uVar6 & (ulong)local_858);
        auVar229._0_8_ = -(1.0 / dVar177) * dVar191;
        auVar229._8_8_ = (1.0 / auVar41._0_8_) * dVar191;
        auVar85 = divpd(auVar229,_DAT_00f54c20);
        auVar109._0_8_ = auVar220._0_8_ * dVar191;
        auVar109._8_8_ = auVar220._8_8_ * dVar191;
        auVar110 = divpd(auVar109,_DAT_00f54c30);
        auVar165._0_8_ = auVar84._0_8_ * dVar191;
        auVar165._8_8_ = auVar84._8_8_ * dVar191;
        auVar106 = divpd(auVar165,_DAT_00f54c40);
        auVar125._0_8_ = dVar191 * auVar160._0_8_;
        auVar125._8_8_ = dVar191 * auVar160._8_8_;
        auVar126 = divpd(auVar125,_DAT_00f54c50);
        local_288 = ((((((auVar85._8_8_ + auVar85._0_8_) - auVar110._8_8_) + auVar110._0_8_) -
                      auVar106._8_8_) + auVar106._0_8_) - auVar126._8_8_) + auVar126._0_8_;
      }
      auVar147._0_8_ = dVar155 * dVar140;
      auVar147._8_8_ = dVar208 * dVar140;
      auVar68._0_8_ = dVar178 * auVar147._8_8_;
      dVar202 = dVar202 * dVar140;
      auVar42._0_8_ = dVar202 * dVar208;
      auVar42._8_8_ = dVar140 * dVar178;
      auVar111._8_8_ = auVar42._0_8_;
      auVar111._0_8_ = dVar202;
      auVar166._0_8_ = dVar178 * dVar202;
      auVar166._8_8_ = dVar178 * auVar42._0_8_;
      auVar127._8_8_ = auVar68._0_8_;
      auVar127._0_8_ = auVar166._0_8_;
      auVar145 = divpd(local_398._0_16_,auVar127);
      auVar90._8_8_ = auVar193._8_8_;
      auVar90._0_8_ = 0x3ff0000000000000;
      auVar68._8_8_ = dVar140;
      auVar193._0_8_ = 0x3ff0000000000000;
      auVar85 = divpd(auVar193,auVar68);
      auVar213._8_8_ = local_398._8_8_;
      auVar213._0_8_ = 0x3ff0000000000000;
      auVar124 = divpd(auVar213,auVar166);
      auVar167._8_8_ = dVar202;
      auVar167._0_8_ = auVar166._8_8_;
      auVar69._8_8_ = auVar193._8_8_;
      auVar69._0_8_ = 0x3ff0000000000000;
      auVar110 = divpd(auVar69,auVar167);
      auVar126 = divpd(auVar142,auVar111);
      dVar155 = (1.0 / auVar147._8_8_) * -0.005357142857142857;
      auVar143 = divpd(local_398._0_16_,auVar42);
      auVar106 = divpd(auVar90,auVar147);
      auVar43._8_8_ = auVar42._8_8_;
      auVar43._0_8_ = auVar147._8_8_;
      auVar142 = divpd(auVar142,auVar43);
      dVar97 = dVar97 * dVar24;
      dVar191 = dVar24 * dVar56 * 256.0;
      dVar78 = (1.0 / (dVar24 * dVar56)) * dVar78;
      dVar140 = (1.0 / dVar24) * dVar25 * -10.0;
      uVar7 = -(ulong)(0.27 < dVar15);
      local_518 = auVar85._0_8_;
      dStack_510 = auVar85._8_8_;
      local_528 = auVar110._0_8_;
      dStack_520 = auVar110._8_8_;
      local_508 = auVar126._0_8_;
      dStack_500 = auVar126._8_8_;
      if (dVar15 < 0.27) {
        dVar178 = (double)(~uVar7 & (ulong)local_858);
        dVar202 = dVar191 * dVar178;
        local_298 = dVar97 * 48.0 * dVar178 +
                    dVar56 * 24.0 *
                    (dVar140 * dVar178 +
                    dVar178 * 10.0 * 1.7724538509055159 * dVar26 +
                    dVar24 * dVar178 * -72.0 +
                    (dVar24 * dVar178 * 40.0 - dVar202) * dVar25 + dVar25 * dVar178 * dVar78 * 0.5 +
                    dVar202);
      }
      else {
        dVar178 = (double)(uVar7 & (ulong)local_858);
        auVar197._0_8_ = auVar143._0_8_ * dVar178;
        auVar197._8_8_ = auVar143._8_8_ * dVar178;
        auVar198 = divpd(auVar197,_DAT_00fb6590);
        auVar221._0_8_ = auVar145._0_8_ * dVar178;
        auVar221._8_8_ = auVar145._8_8_ * dVar178;
        auVar222 = divpd(auVar221,_DAT_00fb65a0);
        auVar205._0_8_ = -(auVar193._8_8_ / auVar68._0_8_) * dVar178;
        auVar205._8_8_ = (auVar193._8_8_ / auVar166._8_8_) * dVar178;
        auVar185 = divpd(auVar205,_DAT_00fb65b0);
        auVar214._0_8_ = auVar124._0_8_ * dVar178;
        auVar214._8_8_ = auVar124._8_8_ * dVar178;
        auVar215 = divpd(auVar214,_DAT_00fb65c0);
        auVar70._0_8_ = local_518 * dVar178;
        auVar70._8_8_ = dStack_510 * dVar178;
        auVar110 = divpd(auVar70,_DAT_00fb65d0);
        auVar188._0_8_ = local_528 * dVar178;
        auVar188._8_8_ = dStack_520 * dVar178;
        auVar162 = divpd(auVar188,_DAT_00fb65e0);
        auVar91._0_8_ = auVar106._0_8_ * dVar178;
        auVar91._8_8_ = auVar106._8_8_ * dVar178;
        auVar126 = divpd(auVar91,_DAT_00fb65f0);
        auVar189._0_8_ = local_508 * dVar178;
        auVar189._8_8_ = dStack_500 * dVar178;
        auVar190 = divpd(auVar189,_DAT_00fb6600);
        auVar112._0_8_ = dVar178 * auVar142._0_8_;
        auVar112._8_8_ = dVar178 * auVar142._8_8_;
        auVar85 = divpd(auVar112,_DAT_00fb6610);
        local_298 = auVar85._8_8_ +
                    auVar190._8_8_ +
                    auVar126._8_8_ +
                    auVar162._8_8_ +
                    auVar110._8_8_ +
                    auVar215._8_8_ +
                    (((auVar198._0_8_ - auVar198._8_8_) + auVar222._0_8_) - auVar222._8_8_) +
                    ((auVar193._8_8_ / auVar166._0_8_) * dVar178) / 8.121312287389663e+33 +
                    auVar85._0_8_ +
                    auVar190._0_8_ +
                    auVar126._0_8_ +
                    auVar162._0_8_ +
                    auVar110._0_8_ +
                    auVar215._0_8_ +
                    (1.0 / auVar42._8_8_) * -3.0438311688311688e-05 * dVar178 +
                    ((1.0 / auVar42._0_8_) * dVar178) / 1920.0 +
                    dVar155 * dVar178 + auVar185._8_8_ + auVar185._0_8_;
      }
      local_798 = local_798 * (dVar80 / dVar17);
      dVar178 = local_868 * 1.5874010519681996 * dVar75;
      dVar202 = dVar178 * 0.24256886666666666;
      auVar128._0_8_ = dVar206 * dVar204;
      auVar128._8_8_ = dVar204;
      auVar148._0_8_ = dVar209 * auVar128._0_8_;
      auVar148._8_8_ = dVar209 * dVar204;
      auVar44._0_8_ = auVar128._0_8_ * dVar212;
      auVar44._8_8_ = dVar204 * dVar212;
      auVar216._8_8_ = dVar135;
      auVar216._0_8_ = dVar135;
      auVar92._8_8_ = dVar135;
      auVar92._0_8_ = dVar135;
      auVar85 = divpd(auVar92,auVar44);
      auVar168._0_8_ = dVar212 * auVar148._0_8_;
      auVar168._8_8_ = dVar212 * auVar148._8_8_;
      auVar45._8_8_ = dVar135;
      auVar45._0_8_ = dVar135;
      auVar110 = divpd(auVar45,auVar128);
      auVar223._8_8_ = dVar135;
      auVar223._0_8_ = dVar135;
      auVar198 = divpd(auVar223,auVar148);
      auVar190 = divpd(auVar216,auVar168);
      auVar46._8_8_ = auVar228._0_8_;
      auVar46._0_8_ = auVar228._0_8_;
      auVar169._8_8_ = auVar228._0_8_;
      auVar169._0_8_ = auVar228._0_8_;
      auVar162 = divpd(auVar169,auVar128);
      auVar126 = divpd(auVar46,auVar148);
      dVar204 = (1.0 / auVar148._8_8_) * -0.001530612244897959;
      dVar218 = (1.0 / dVar203) * dVar218;
      dVar156 = dVar156 * dVar28;
      dVar135 = dVar181 * dVar82 * 72.0;
      dVar208 = dVar10 * 1.7724538509055159 * 240.0;
      dVar156 = dVar156 + dVar156;
      uVar8 = -(ulong)(0.32 < dVar15);
      local_248 = auVar110._0_8_;
      dStack_240 = auVar110._8_8_;
      local_488 = auVar126._0_8_;
      dStack_480 = auVar126._8_8_;
      if (dVar15 < 0.32) {
        local_858 = (double)(~uVar8 & (ulong)local_858);
        dVar181 = local_858 * 1.1428571428571428 * dVar57 +
                  dVar10 * 1.1428571428571428 *
                  ((dVar208 * local_858 * dVar29 +
                   (dVar179 * local_858 * 30720.0 +
                   dVar10 * local_858 * 448.0 + dVar203 * local_858 * -5760.0) * dVar59 +
                   dVar135 * local_858 +
                   (dVar196 * local_858 * -2880.0 +
                   dVar82 * local_858 * 768.0 +
                   local_858 * -8.0 +
                   dVar58 * -1105920.0 * local_858 + dVar180 * 26880.0 * local_858) * dVar28 +
                   dVar28 * local_858 * dVar218 * 0.5) - dVar27 * local_858 * dVar156);
      }
      else {
        local_858 = (double)((ulong)local_858 & uVar8);
        auVar113._0_8_ = local_248 * local_858;
        auVar113._8_8_ = dStack_240 * local_858;
        auVar126 = divpd(auVar113,_DAT_00fb6620);
        auVar224._0_8_ = auVar198._0_8_ * local_858;
        auVar224._8_8_ = auVar198._8_8_ * local_858;
        auVar225 = divpd(auVar224,_DAT_00fb6630);
        auVar93._0_8_ = auVar85._0_8_ * local_858;
        auVar93._8_8_ = auVar85._8_8_ * local_858;
        auVar110 = divpd(auVar93,_DAT_00fb6640);
        auVar217._0_8_ = auVar190._0_8_ * local_858;
        auVar217._8_8_ = auVar190._8_8_ * local_858;
        auVar222 = divpd(auVar217,_DAT_00fb6650);
        auVar170._0_8_ = auVar162._0_8_ * local_858;
        auVar170._8_8_ = auVar162._8_8_ * local_858;
        auVar215 = divpd(auVar170,_DAT_00fb6660);
        auVar129._0_8_ = local_858 * local_488;
        auVar129._8_8_ = local_858 * dStack_480;
        auVar185 = divpd(auVar129,_DAT_00fb6670);
        dVar181 = (((((((((((((local_858 * (1.0 / auVar168._0_8_)) / 8272281600.0 +
                             ((1.0 / auVar168._8_8_) * local_858) / -210862080.0 +
                             ((1.0 / auVar44._0_8_) * local_858) / 6150144.0 +
                             (1.0 / auVar44._8_8_) * -4.6972703222703225e-06 * local_858 +
                             dVar204 * local_858 + ((1.0 / auVar148._0_8_) * local_858) / 9408.0) -
                            auVar126._8_8_) + auVar126._0_8_) - auVar225._8_8_) + auVar225._0_8_) -
                        auVar110._8_8_) + auVar110._0_8_) - auVar222._8_8_) + auVar222._0_8_) -
                    auVar215._8_8_) + auVar215._0_8_) - auVar185._8_8_) + auVar185._0_8_;
      }
      dVar206 = dVar95 / dVar17;
      dVar21 = dVar21 * (dVar22 / dVar74);
      dVar74 = dVar75 * 1.5874010519681996;
      dVar212 = dVar100 * dVar115 * 1.8171205928321397 * -0.1728395061728395;
      dVar209 = local_860 * dVar94 * dVar101 * 1.8171205928321397 * -0.010531842222222223;
      dVar49 = (dVar49 * dVar62 * dVar120) / -54.0;
      if (dVar34 < 1.35) {
        dVar49 = (double)(~-(ulong)(1.35 < dVar34) & (ulong)dVar49);
        dVar52 = dVar52 * -2.6666666666666665 *
                 (((dVar52 + dVar52) *
                   (((dVar36 + -1.0) * dVar52 * -4.0 * dVar49 +
                    (1.0 / (dVar60 * dVar52)) * dVar49 * dVar36 * 0.5) -
                   (1.0 / dVar52) * dVar49 * dVar36) + (dVar157 + dVar157) * dVar49) -
                 (1.0 / dVar60) * dVar36 * dVar49);
        dVar35 = dVar49 * -2.6666666666666665 * dVar35;
      }
      else {
        auVar226._0_8_ = dVar182 * dVar102;
        auVar226._8_8_ = dVar192 * dVar102;
        auVar110 = divpd(_DAT_00f48900,auVar226);
        auVar3._8_8_ = dVar103;
        auVar3._0_8_ = dVar103;
        auVar215 = divpd(auVar3,auVar226);
        dVar49 = (double)(-(ulong)(1.35 < dVar34) & (ulong)dVar49);
        auVar194._0_8_ = auVar110._0_8_ * dVar49;
        auVar194._8_8_ = auVar110._8_8_ * dVar49;
        auVar185 = divpd(auVar194,_DAT_00f5cde0);
        auVar149._8_8_ = 0x3ff0000000000000;
        auVar149._0_8_ = dVar103;
        auVar171._8_8_ = auVar226._8_8_ * dVar182;
        auVar171._0_8_ = dVar102;
        auVar110 = divpd(auVar149,auVar171);
        auVar150._0_8_ = auVar110._0_8_ * dVar49;
        auVar150._8_8_ = auVar110._8_8_ * dVar49;
        auVar126 = divpd(auVar150,_DAT_00f54c30);
        auVar207._0_8_ = auVar215._0_8_ * dVar49;
        auVar207._8_8_ = auVar215._8_8_ * dVar49;
        auVar215 = divpd(auVar207,_DAT_00f54c40);
        auVar110 = divpd(auVar121,auVar171);
        auVar130._0_8_ = auVar110._0_8_ * dVar49;
        auVar130._8_8_ = auVar110._8_8_ * dVar49;
        auVar110 = divpd(auVar130,_DAT_00f54c50);
        dVar52 = auVar110._0_8_;
        dVar35 = (((((auVar185._0_8_ - auVar185._8_8_) - auVar126._8_8_) + auVar126._0_8_) -
                  auVar215._8_8_) + auVar215._0_8_) - auVar110._8_8_;
      }
      dVar49 = dVar48 * dVar32;
      dVar101 = dVar98 * dVar98 * dVar98 * dVar98;
      dVar34 = 1.0 / (dVar101 * dVar101 * dVar98);
      dVar103 = dVar48 * dVar119;
      dVar60 = -(dVar80 / dVar17);
      dVar102 = dVar118 * dVar206 * -0.3111111111111111;
      dVar17 = dVar33 * dVar34;
      dVar101 = -(dVar21 * 6.0);
      dVar36 = 0.0;
      if (dVar83 < dVar30) {
        dVar36 = (dVar141 * dVar159 + dVar141 * dVar159 + dVar48 * dVar159 * 9.0) * dVar22;
        dVar157 = dVar48 * dVar159 * 6.0 * dVar21 - dVar36;
        dVar178 = dVar63 * -0.07407407407407407 +
                  (dVar178 * -1.6666666666666667 + dVar37 / 3.0) * 1.8171205928321397 * dVar94 *
                  0.25;
        dVar114 = dVar159 * dVar105 +
                  dVar137 * -1.0814814814814815 * dVar159 * dVar138 +
                  dVar141 * dVar178 * -1.0814814814814815 * dVar138 +
                  dVar137 * 1.4419753086419753 * dVar178 +
                  dVar114 * -0.006350657928161358 + dVar158 * -1.1111111111111112 * dVar37;
        dVar36 = ((dVar114 * dVar17) / 10.0 +
                 dVar157 * dVar98 +
                 ((dVar63 * -0.17051554074074074 +
                  (dVar37 * -0.031646617777777775 - dVar202) * 0.5555555555555556 *
                  -1.8171205928321397 * dVar94) * 0.7777777777777778 * dVar95 +
                  (dVar134 * dVar60) / 5.0 + dVar102 * dVar134) * dVar79 +
                 dVar103 * dVar159 * dVar101 +
                 (dVar36 * dVar119 -
                 ((dVar34 * dVar114 * dVar61) / 10.0 +
                 dVar33 * (dVar35 + dVar52) * dVar98 +
                 dVar117 * dVar157 * dVar98 +
                 (dVar134 * dVar206 * dVar74 * dVar209 +
                 dVar181 * 1.8171205928321397 * dVar94 * 0.026329605555555555 * dVar116 +
                 dVar134 * dVar94 * dVar206 * dVar212 +
                 (dVar37 * -0.11279007555555555 + dVar202) * dVar115 * 0.43209876543209874 * dVar23
                 + local_298 * dVar100 * 0.43209876543209874 * dVar23 +
                   local_288 * dVar80 + (dVar134 * local_798) / -5.0 +
                 dVar136 * -0.07021228148148148 * dVar37 * dVar95) * dVar79 +
                 dVar36 * dVar32 + dVar49 * dVar159 * dVar101) * p->cam_beta)) * dVar50 +
                 (dVar11 / (dVar12 * dVar12)) * -0.9847450218426964 * dVar99 * 0.125;
      }
      dVar11 = dVar9 + dVar9;
      pdVar2 = out->vrho;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar4 = (long)(p->dim).vrho * sVar5;
        pdVar2[lVar4] = dVar36 * dVar11 + dVar51 + pdVar2[lVar4];
      }
      dVar12 = (double)(-(ulong)(dVar14 < 1.0) & (ulong)((1.0 / dVar9) * dVar47 * 0.125));
      dVar76 = dVar76 * local_860 * 1.2599210498948732 * dVar96;
      dVar47 = dVar72 * 0.1504548888888889 * dVar74 + dVar76 * 0.01075979618490518;
      dVar9 = 0.0;
      if (1e-10 <= dVar53) {
        dVar9 = (dVar73 * dVar16 * dVar120 * dVar47) / -180.0;
      }
      if (dVar15 < 1.35) {
        dVar120 = (double)(~uVar6 & (ulong)dVar9);
        dVar16 = (dVar139 * dVar120 + dVar55 * dVar120 * dVar20 * 0.5) - dVar18 * dVar120 * dVar20;
        dVar16 = dVar54 * -2.6666666666666665 *
                 ((dVar16 + dVar16) * dVar54 + ((dVar120 + dVar120) * dVar77 - dVar183 * dVar120));
        dVar19 = dVar120 * -2.6666666666666665 * dVar19;
      }
      else {
        dVar16 = (double)(uVar6 & (ulong)dVar9);
        auVar172._0_8_ = -(1.0 / dVar177) * dVar16;
        auVar172._8_8_ = (1.0 / auVar41._0_8_) * dVar16;
        auVar110 = divpd(auVar172,_DAT_00f54c20);
        auVar151._0_8_ = auVar220._0_8_ * dVar16;
        auVar151._8_8_ = auVar220._8_8_ * dVar16;
        auVar220 = divpd(auVar151,_DAT_00f54c30);
        auVar199._0_8_ = auVar84._0_8_ * dVar16;
        auVar199._8_8_ = auVar84._8_8_ * dVar16;
        auVar126 = divpd(auVar199,_DAT_00f54c40);
        auVar195._0_8_ = auVar160._0_8_ * dVar16;
        auVar195._8_8_ = auVar160._8_8_ * dVar16;
        auVar84 = divpd(auVar195,_DAT_00f54c50);
        dVar16 = auVar84._0_8_;
        dVar19 = (((((auVar110._8_8_ + auVar110._0_8_) - auVar220._8_8_) + auVar220._0_8_) -
                  auVar126._8_8_) + auVar126._0_8_) - auVar84._8_8_;
      }
      if (dVar15 < 0.27) {
        dVar120 = (double)(~uVar7 & (ulong)dVar9);
        dVar191 = dVar191 * dVar120;
        dVar56 = dVar56 * (dVar140 * dVar120 +
                          dVar120 * 10.0 * 1.7724538509055159 * dVar26 +
                          dVar24 * dVar120 * -72.0 +
                          dVar78 * dVar25 * dVar120 * 0.5 +
                          (dVar24 * dVar120 * 40.0 - dVar191) * dVar25 + dVar191) * 24.0;
        dVar97 = dVar120 * 48.0 * dVar97;
      }
      else {
        dVar120 = (double)(uVar7 & (ulong)dVar9);
        auVar211._0_8_ = auVar143._0_8_ * dVar120;
        auVar211._8_8_ = auVar143._8_8_ * dVar120;
        auVar143 = divpd(auVar211,_DAT_00fb6590);
        auVar173._0_8_ = auVar145._0_8_ * dVar120;
        auVar173._8_8_ = auVar145._8_8_ * dVar120;
        auVar220 = divpd(auVar173,_DAT_00fb65a0);
        auVar227._0_8_ = -(auVar193._8_8_ / auVar68._0_8_) * dVar120;
        auVar227._8_8_ = (auVar193._8_8_ / auVar166._8_8_) * dVar120;
        auVar145 = divpd(auVar227,_DAT_00fb65b0);
        auVar174._0_8_ = auVar124._0_8_ * dVar120;
        auVar174._8_8_ = auVar124._8_8_ * dVar120;
        auVar110 = divpd(auVar174,_DAT_00fb65c0);
        auVar152._0_8_ = local_518 * dVar120;
        auVar152._8_8_ = dStack_510 * dVar120;
        auVar84 = divpd(auVar152,_DAT_00fb65d0);
        auVar175._0_8_ = local_528 * dVar120;
        auVar175._8_8_ = dStack_520 * dVar120;
        auVar126 = divpd(auVar175,_DAT_00fb65e0);
        auVar153._0_8_ = auVar106._0_8_ * dVar120;
        auVar153._8_8_ = auVar106._8_8_ * dVar120;
        auVar160 = divpd(auVar153,_DAT_00fb65f0);
        auVar200._0_8_ = local_508 * dVar120;
        auVar200._8_8_ = dStack_500 * dVar120;
        auVar121 = divpd(auVar200,_DAT_00fb6600);
        auVar176._0_8_ = auVar142._0_8_ * dVar120;
        auVar176._8_8_ = auVar142._8_8_ * dVar120;
        auVar142 = divpd(auVar176,_DAT_00fb6610);
        dVar56 = auVar142._0_8_ +
                 auVar121._0_8_ +
                 auVar160._0_8_ +
                 auVar126._0_8_ +
                 auVar84._0_8_ +
                 auVar110._0_8_ +
                 (1.0 / auVar42._8_8_) * dVar120 * -3.0438311688311688e-05 +
                 ((1.0 / auVar42._0_8_) * dVar120) / 1920.0 +
                 dVar155 * dVar120 + auVar145._8_8_ + auVar145._0_8_;
        dVar97 = auVar142._8_8_ +
                 auVar121._8_8_ +
                 auVar160._8_8_ +
                 auVar126._8_8_ +
                 auVar84._8_8_ +
                 auVar110._8_8_ +
                 (((auVar143._0_8_ - auVar143._8_8_) + auVar220._0_8_) - auVar220._8_8_) +
                 ((auVar193._8_8_ / auVar166._0_8_) * dVar120) / 8.121312287389663e+33;
      }
      if (dVar15 < 0.32) {
        dVar9 = (double)(~uVar8 & (ulong)dVar9);
        dVar10 = dVar10 * 1.1428571428571428 *
                 ((dVar208 * dVar29 * dVar9 +
                  dVar59 * (dVar179 * dVar9 * 30720.0 +
                           dVar10 * dVar9 * 448.0 + dVar203 * dVar9 * -5760.0) +
                  dVar135 * dVar9 +
                  dVar218 * dVar28 * dVar9 * 0.5 +
                  (dVar180 * dVar9 * 26880.0 +
                  dVar196 * dVar9 * -2880.0 +
                  dVar82 * dVar9 * 768.0 + dVar9 * -1105920.0 * dVar58 + dVar9 * -8.0) * dVar28) -
                 dVar27 * dVar156 * dVar9);
        dVar57 = dVar9 * 1.1428571428571428 * dVar57;
      }
      else {
        dVar9 = (double)(uVar8 & (ulong)dVar9);
        auVar131._0_8_ = local_248 * dVar9;
        auVar131._8_8_ = dStack_240 * dVar9;
        auVar160 = divpd(auVar131,_DAT_00fb6620);
        auVar201._0_8_ = auVar198._0_8_ * dVar9;
        auVar201._8_8_ = auVar198._8_8_ * dVar9;
        auVar126 = divpd(auVar201,_DAT_00fb6630);
        auVar71._0_8_ = auVar85._0_8_ * dVar9;
        auVar71._8_8_ = auVar85._8_8_ * dVar9;
        auVar84 = divpd(auVar71,_DAT_00fb6640);
        auVar132._0_8_ = auVar190._0_8_ * dVar9;
        auVar132._8_8_ = auVar190._8_8_ * dVar9;
        auVar220 = divpd(auVar132,_DAT_00fb6650);
        auVar154._0_8_ = auVar162._0_8_ * dVar9;
        auVar154._8_8_ = auVar162._8_8_ * dVar9;
        auVar142 = divpd(auVar154,_DAT_00fb6660);
        auVar133._0_8_ = local_488 * dVar9;
        auVar133._8_8_ = dStack_480 * dVar9;
        auVar110 = divpd(auVar133,_DAT_00fb6670);
        dVar10 = auVar110._0_8_;
        dVar57 = (((((((((((((1.0 / auVar168._0_8_) * dVar9) / 8272281600.0 +
                           ((1.0 / auVar168._8_8_) * dVar9) / -210862080.0 +
                           ((1.0 / auVar44._0_8_) * dVar9) / 6150144.0 +
                           (1.0 / auVar44._8_8_) * dVar9 * -4.6972703222703225e-06 +
                           dVar204 * dVar9 + ((1.0 / auVar148._0_8_) * dVar9) / 9408.0) -
                          auVar160._8_8_) + auVar160._0_8_) - auVar126._8_8_) + auVar126._0_8_) -
                      auVar84._8_8_) + auVar84._0_8_) - auVar220._8_8_) + auVar220._0_8_) -
                  auVar142._8_8_) + auVar142._0_8_) - auVar110._8_8_;
      }
      dVar9 = 0.0;
      if (dVar83 < dVar30) {
        dVar9 = (dVar141 * dVar12 + dVar141 * dVar12 + dVar12 * dVar48 * 9.0) * dVar22;
        dVar120 = dVar21 * 6.0 * dVar12 * dVar48 - dVar9;
        dVar15 = dVar94 * 1.5874010519681996 * dVar75;
        dVar15 = dVar105 * dVar12 +
                 dVar12 * dVar137 * -1.0814814814814815 * dVar138 +
                 dVar141 * dVar75 * dVar72 * 1.5874010519681996 * dVar138 * 0.003755144032921811 +
                 dVar137 * 1.8171205928321397 * dVar15 * -0.005006858710562414 +
                 dVar76 * 0.002381496723060509 + dVar104 * 0.4166666666666667 * dVar15;
        dVar9 = ((dVar15 * dVar17) / 10.0 +
                dVar120 * dVar98 +
                (dVar102 * dVar47 +
                dVar72 * 0.04460577520576132 * dVar74 * dVar95 + (dVar60 * dVar47) / 5.0) * dVar79 +
                dVar12 * dVar103 * dVar101 +
                (dVar9 * dVar119 -
                ((dVar15 * dVar34 * dVar61) / 10.0 +
                dVar120 * dVar117 * dVar98 +
                (dVar209 * dVar206 * dVar47 * dVar74 +
                dVar31 * dVar74 * dVar95 +
                (dVar57 + dVar10) * 1.8171205928321397 * dVar94 * 0.026329605555555555 * dVar116 +
                dVar212 * dVar94 * dVar206 * dVar47 +
                dVar75 * dVar115 * 1.5874010519681996 * 0.018276169650205763 * dVar23 +
                dVar100 * (dVar97 + dVar56) * 0.43209876543209874 * dVar23 +
                (dVar19 + dVar16) * dVar80 + (local_798 * dVar47) / -5.0) * dVar79 +
                dVar9 * dVar32 + dVar12 * dVar49 * dVar101) * p->cam_beta)) * dVar50;
      }
      pdVar2 = out->vsigma;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar4 = (long)(p->dim).vsigma * sVar5;
        pdVar2[lVar4] = dVar9 * dVar11 + pdVar2[lVar4];
      }
      pdVar2 = out->vlapl;
      if ((pdVar2 != (double *)0x0) && ((~p->info->flags & 0x8002U) == 0)) {
        lVar4 = (long)(p->dim).vlapl * sVar5;
        pdVar2[lVar4] = pdVar2[lVar4] + 0.0;
      }
      dVar9 = 0.0;
      dVar10 = 0.0;
      if (dVar14 < 1.0) {
        dVar10 = (1.0 / (local_868 * local_868)) * dVar13 * -0.125;
      }
      if (dVar83 < dVar30) {
        dVar22 = dVar22 * (dVar141 * dVar10 + dVar141 * dVar10 + dVar48 * dVar10 * 9.0);
        dVar83 = dVar94 * dVar95 * dVar81 * 1.8171205928321397;
        dVar9 = dVar48 * dVar10 * 6.0 * dVar21 - dVar22;
        dVar141 = dVar105 * dVar10 +
                  dVar137 * dVar10 * -1.0814814814814815 * dVar138 +
                  dVar141 * dVar94 *
                  dVar81 * 1.5874010519681996 * 1.8171205928321397 * -0.27037037037037037 * dVar138
                  + dVar81 * 1.8171205928321397 * dVar94 *
                    dVar137 * 0.36049382716049383 * 1.5874010519681996;
        dVar9 = dVar50 * ((dVar17 * dVar141) / 10.0 +
                         dVar9 * dVar98 +
                         dVar83 * dVar79 * 1.5874010519681996 * -0.06288822469135802 +
                         dVar103 * dVar10 * dVar101 +
                         (dVar119 * dVar22 -
                         ((dVar61 * dVar34 * dVar141) / 10.0 +
                         dVar117 * dVar9 * dVar98 +
                         dVar115 * 1.5874010519681996 * dVar79 * -0.06288822469135802 * dVar83 +
                         dVar32 * dVar22 + dVar49 * dVar10 * dVar101) * p->cam_beta));
      }
      pdVar2 = out->vtau;
      if ((pdVar2 != (double *)0x0) && ((~p->info->flags & 0x10002U) == 0)) {
        lVar4 = (long)(p->dim).vtau * sVar5;
        pdVar2[lVar4] = dVar11 * dVar9 + pdVar2[lVar4];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}